

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O1

ps_lattice_t * fsg_search_lattice(ps_search_t *search)

{
  uint *puVar1;
  float fVar2;
  fsg_model_t *fsg;
  gnode_s *pgVar3;
  void *ptr;
  logmath_t *plVar4;
  int32 iVar5;
  s3wid_t sVar6;
  int iVar7;
  ps_lattice_t *ppVar8;
  fsg_hist_entry_t *pfVar9;
  fsg_hist_entry_t *pfVar10;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar11;
  fsg_arciter_t *itor_00;
  glist_t pgVar12;
  ps_latnode_t *ppVar13;
  ps_latnode_t *ppVar14;
  gnode_t *gn;
  int iVar15;
  long lVar16;
  undefined8 *puVar17;
  uint uVar18;
  char *pcVar19;
  int32 iVar20;
  char *pcVar21;
  int32 iVar22;
  bool bVar23;
  double dVar24;
  int32 in_stack_ffffffffffffffa8;
  
  ppVar8 = search->dag;
  if ((ppVar8 == (ps_lattice_t *)0x0) || (ppVar8->n_frames != search[1].post)) {
    ps_lattice_free(ppVar8);
    search->dag = (ps_lattice_t *)0x0;
    ppVar8 = ps_lattice_init_search(search,search[1].post);
    fsg = (fsg_model_t *)search[1].type;
    iVar5 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    if (0 < iVar5) {
      iVar22 = 0;
      do {
        pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,iVar22);
        if ((pfVar9->fsglink != (fsg_link_t *)0x0) && (pfVar9->fsglink->wid != -1)) {
          if (pfVar9->pred == 0) {
            iVar20 = pfVar9->score;
            uVar18 = 0;
          }
          else {
            pfVar10 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar9->pred);
            iVar20 = pfVar9->score - pfVar10->score;
            uVar18 = pfVar10->frame + 1;
          }
          new_node(ppVar8,(fsg_model_t *)(ulong)uVar18,pfVar9->frame,pfVar9->fsglink->wid,
                   pfVar9->fsglink->to_state,iVar20,in_stack_ffffffffffffffa8);
        }
        iVar22 = iVar22 + 1;
      } while (iVar5 != iVar22);
    }
    iVar5 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    if (0 < iVar5) {
      iVar22 = 0;
      do {
        pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,iVar22);
        if ((pfVar9->fsglink != (fsg_link_t *)0x0) && (pfVar9->fsglink->wid != -1)) {
          if (pfVar9->pred == 0) {
            iVar20 = pfVar9->score;
            iVar15 = 0;
          }
          else {
            pfVar10 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar9->pred);
            iVar15 = pfVar10->frame + 1;
            iVar20 = pfVar9->score - pfVar10->score;
          }
          iVar7 = pfVar9->fsglink->to_state;
          ppVar14 = ppVar8->nodes;
          if (ppVar14 != (ps_latnode_t *)0x0) {
            do {
              if (((ppVar14->sf == iVar15) && (ppVar14->wid == pfVar9->fsglink->wid)) &&
                 (ppVar14->node_id == iVar7)) break;
              ppVar14 = ppVar14->next;
            } while (ppVar14 != (ps_latnode_s *)0x0);
          }
          iVar15 = pfVar9->frame;
          itor = fsg_model_arcs(fsg,iVar7);
          if (itor != (fsg_arciter_t *)0x0) {
            iVar15 = iVar15 + 1;
            do {
              pfVar11 = fsg_arciter_get(itor);
              if (pfVar11->wid < 0) {
                for (itor_00 = fsg_model_arcs(fsg,pfVar11->to_state);
                    itor_00 != (fsg_arciter_t *)0x0; itor_00 = fsg_arciter_next(itor_00)) {
                  pfVar11 = fsg_arciter_get(itor_00);
                  if (pfVar11->wid != -1) {
                    ppVar13 = ppVar8->nodes;
                    if (ppVar13 != (ps_latnode_t *)0x0) {
                      do {
                        if (((ppVar13->sf == iVar15) && (ppVar13->wid == pfVar11->wid)) &&
                           (ppVar13->node_id == pfVar11->to_state)) break;
                        ppVar13 = ppVar13->next;
                      } while (ppVar13 != (ps_latnode_s *)0x0);
                    }
                    if (ppVar13 != (ps_latnode_t *)0x0) {
                      ps_lattice_link(ppVar8,ppVar14,ppVar13,iVar20,pfVar9->frame);
                    }
                  }
                }
              }
              else {
                for (ppVar13 = ppVar8->nodes;
                    (ppVar13 != (ps_latnode_t *)0x0 &&
                    (((ppVar13->sf != iVar15 || (ppVar13->wid != pfVar11->wid)) ||
                     (ppVar13->node_id != pfVar11->to_state)))); ppVar13 = ppVar13->next) {
                }
                if (ppVar13 != (ps_latnode_t *)0x0) {
                  ps_lattice_link(ppVar8,ppVar14,ppVar13,iVar20,pfVar9->frame);
                }
              }
              itor = fsg_arciter_next(itor);
            } while (itor != (fsg_arciter_t *)0x0);
          }
        }
        iVar22 = iVar22 + 1;
      } while (iVar22 != iVar5);
    }
    ppVar14 = ppVar8->nodes;
    bVar23 = false;
    if (ppVar14 == (ps_latnode_t *)0x0) {
      pgVar12 = (glist_t)0x0;
    }
    else {
      iVar15 = 0;
      pgVar12 = (glist_t)0x0;
      do {
        if ((ppVar14->sf == 0) && (ppVar14->exits != (latlink_list_t *)0x0)) {
          pcVar19 = "(NULL)";
          if ((long)ppVar14->wid != -1) {
            pcVar19 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar14->wid * 8);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x4f3,"Start node candidate %s.%d:%d:%d\n",pcVar19,(ulong)(uint)ppVar14->sf,
                  (ulong)(uint)ppVar14->fef,(ulong)(uint)ppVar14->lef);
          pgVar12 = glist_add_ptr(pgVar12,ppVar14);
          iVar15 = iVar15 + 1;
        }
        ppVar14 = ppVar14->next;
      } while (ppVar14 != (ps_latnode_s *)0x0);
      bVar23 = iVar15 == 1;
    }
    if (bVar23) {
      ppVar14 = (ps_latnode_t *)(pgVar12->data).ptr;
    }
    else {
      iVar15 = fsg_model_word_add((fsg_model_t *)search[1].type,"<s>");
      if (*(long *)(search[1].type + 0x20) != 0) {
        iVar7 = iVar15 + 0x1f;
        if (-1 < iVar15) {
          iVar7 = iVar15;
        }
        puVar1 = (uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar7 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)iVar15 & 0x1f);
      }
      ppVar14 = new_node(ppVar8,(fsg_model_t *)0x0,0,iVar15,-1,0,in_stack_ffffffffffffffa8);
      for (pgVar3 = pgVar12; pgVar3 != (glist_t)0x0; pgVar3 = pgVar3->next) {
        ps_lattice_link(ppVar8,ppVar14,(ps_latnode_t *)(pgVar3->data).ptr,0,0);
      }
    }
    glist_free(pgVar12);
    ppVar8->start = ppVar14;
    if (ppVar14 == (ps_latnode_t *)0x0) {
      pcVar19 = "Failed to find the start node\n";
      lVar16 = 0x5f0;
    }
    else {
      ppVar14 = ppVar8->nodes;
      if (ppVar14 == (ps_latnode_t *)0x0) {
        iVar15 = 0;
        pgVar12 = (glist_t)0x0;
      }
      else {
        pgVar12 = (glist_t)0x0;
        iVar15 = 0;
        do {
          if ((ppVar14->lef == ppVar8->n_frames - 1U) && (ppVar14->entries != (latlink_list_t *)0x0)
             ) {
            pcVar19 = "(NULL)";
            if ((long)ppVar14->wid != -1) {
              pcVar19 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar14->wid * 8);
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                    ,0x51a,"End node candidate %s.%d:%d:%d (%d)\n",pcVar19,(ulong)(uint)ppVar14->sf,
                    (ulong)(uint)ppVar14->fef,(ulong)(uint)ppVar14->lef,
                    (ulong)(uint)(ppVar14->info).fanin);
            pgVar12 = glist_add_ptr(pgVar12,ppVar14);
            iVar15 = iVar15 + 1;
          }
          ppVar14 = ppVar14->next;
        } while (ppVar14 != (ps_latnode_s *)0x0);
      }
      if (iVar15 == 1) {
        ppVar14 = (ps_latnode_t *)(pgVar12->data).i;
      }
      else if (iVar15 == 0) {
        iVar15 = 0;
        ppVar14 = (ps_latnode_t *)0x0;
        for (ppVar13 = ppVar8->nodes; ppVar13 != (ps_latnode_t *)0x0; ppVar13 = ppVar13->next) {
          if ((iVar15 < ppVar13->lef) && (ppVar13->entries != (latlink_list_t *)0x0)) {
            ppVar14 = ppVar13;
            iVar15 = ppVar13->lef;
          }
        }
        if (ppVar14 != (ps_latnode_t *)0x0) {
          if ((long)ppVar14->wid == -1) {
            pcVar19 = "(NULL)";
          }
          else {
            pcVar19 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar14->wid * 8);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x533,"End node %s.%d:%d:%d (%d)\n",pcVar19,(ulong)(uint)ppVar14->sf,
                  (ulong)(uint)ppVar14->fef,(ulong)(uint)ppVar14->lef,
                  (ulong)(uint)(ppVar14->info).fanin);
        }
      }
      else {
        iVar15 = fsg_model_word_add((fsg_model_t *)search[1].type,"</s>");
        if (*(long *)(search[1].type + 0x20) != 0) {
          iVar7 = iVar15 + 0x1f;
          if (-1 < iVar15) {
            iVar7 = iVar15;
          }
          puVar1 = (uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar7 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar15 & 0x1f);
        }
        ppVar14 = new_node(ppVar8,(fsg_model_t *)(ulong)(uint)search[1].post,search[1].post,iVar15,
                           -1,0,in_stack_ffffffffffffffa8);
        for (pgVar3 = pgVar12; pgVar3 != (glist_t)0x0; pgVar3 = pgVar3->next) {
          ps_lattice_link(ppVar8,(ps_latnode_t *)(pgVar3->data).ptr,ppVar14,
                          (((ps_latnode_t *)(pgVar3->data).ptr)->info).fanin,search[1].post);
        }
      }
      glist_free(pgVar12);
      ppVar8->end = ppVar14;
      if (ppVar14 != (ps_latnode_t *)0x0) {
        lVar16 = (long)ppVar8->start->wid;
        pcVar21 = "(NULL)";
        pcVar19 = "(NULL)";
        if (lVar16 != -1) {
          pcVar19 = fsg->vocab[lVar16];
        }
        if ((long)ppVar14->wid != -1) {
          pcVar21 = fsg->vocab[ppVar14->wid];
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x5fb,"lattice start node %s.%d end node %s.%d\n",pcVar19,
                (ulong)(uint)ppVar8->start->sf,pcVar21,(ulong)(uint)ppVar14->sf);
        for (ppVar14 = ppVar8->nodes; ppVar14 != (ps_latnode_t *)0x0; ppVar14 = ppVar14->next) {
          pcVar19 = "(NULL)";
          if ((long)ppVar14->wid != -1) {
            pcVar19 = fsg->vocab[ppVar14->wid];
          }
          sVar6 = dict_wordid(ppVar8->search->dict,pcVar19);
          ppVar14->wid = sVar6;
          ppVar14->basewid = ppVar8->search->dict->word[sVar6].basewid;
        }
        ppVar14 = ppVar8->end;
        ppVar14->reachable = 1;
        gn = glist_add_ptr((glist_t)0x0,ppVar14);
        while (gn != (gnode_t *)0x0) {
          lVar16 = (gn->data).i;
          gn = gnode_free(gn,(gnode_t *)0x0);
          for (puVar17 = *(undefined8 **)(lVar16 + 0x30); puVar17 != (undefined8 *)0x0;
              puVar17 = (undefined8 *)puVar17[1]) {
            ptr = *(void **)*puVar17;
            if (*(short *)((long)ptr + 0x18) == 0) {
              *(undefined2 *)((long)ptr + 0x18) = 1;
              gn = glist_add_ptr(gn,ptr);
            }
          }
        }
        ps_lattice_delete_unreachable(ppVar8);
        plVar4 = fsg->lmath;
        dVar24 = ps_config_float(search->config,"silprob");
        iVar15 = logmath_log(plVar4,(float64)dVar24);
        fVar2 = (float)fsg->lw;
        plVar4 = fsg->lmath;
        dVar24 = ps_config_float(search->config,"fillprob");
        iVar7 = logmath_log(plVar4,(float64)dVar24);
        ps_lattice_penalize_fillers
                  (ppVar8,(int)((float)iVar15 * fVar2) >> 10,
                   (int)((float)iVar7 * (float)fsg->lw) >> 10);
        search->dag = ppVar8;
        return ppVar8;
      }
      pcVar19 = "Failed to find the end node\n";
      lVar16 = 0x5f4;
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,lVar16,pcVar19);
    ps_lattice_free(ppVar8);
    ppVar8 = (ps_lattice_t *)0x0;
  }
  return ppVar8;
}

Assistant:

static ps_lattice_t *
fsg_search_lattice(ps_search_t *search)
{
    fsg_search_t *fsgs;
    fsg_model_t *fsg;
    ps_latnode_t *node;
    ps_lattice_t *dag;
    int32 i, n;

    fsgs = (fsg_search_t *)search;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == fsgs->frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, fsgs->frame);
    fsg = fsgs->fsg;

    /*
     * Each history table entry represents a link in the word graph.
     * The set of nodes is determined by the number of unique
     * (word,start-frame) pairs in the history table.  So we will
     * first find all those nodes.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            /* FIXME: We include the transition score in the lattice
             * link score.  This is because of the practical
             * difficulty of obtaining it separately in bestpath or
             * forward-backward search, and because it is essentially
             * a unigram probability, so there is no need to treat it
             * separately from the acoustic score.  However, it's not
             * clear that this will actually yield correct results.*/
            ascr = fh->score - pfh->score;
            sf = pfh->frame + 1;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }

        /*
         * Note that although scores are tied to links rather than
         * nodes, it's possible that there are no links out of the
         * destination node, and thus we need to preserve its score in
         * case it turns out to be utterance-final.
         */
        new_node(dag, fsg, sf, fh->frame, fh->fsglink->wid, fsg_link_to_state(fh->fsglink), ascr);
    }

    /*
     * Now, we will create links only to nodes that actually exist.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        fsg_arciter_t *itor;
        ps_latnode_t *src, *dest;
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link and calculate its link score. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            sf = pfh->frame + 1;
            ascr = fh->score - pfh->score;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }
        src = find_node(dag, fsg, sf, fh->fsglink->wid, fsg_link_to_state(fh->fsglink));
        sf = fh->frame + 1;

        for (itor = fsg_model_arcs(fsg, fsg_link_to_state(fh->fsglink));
             itor; itor = fsg_arciter_next(itor)) {
            fsg_link_t *link = fsg_arciter_get(itor);
            
            /* FIXME: Need to figure out what to do about tag transitions. */
            if (link->wid >= 0) {
                /*
                 * For each non-epsilon link following this one, look for a
                 * matching node in the lattice and link to it.
                 */
                if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL)
            	    ps_lattice_link(dag, src, dest, ascr, fh->frame);
            }
            else {
                /*
                 * Transitive closure on nulls has already been done, so we
                 * just need to look one link forward from them.
                 */
                fsg_arciter_t *itor2;
                
                /* Add all non-null links out of j. */
                for (itor2 = fsg_model_arcs(fsg, fsg_link_to_state(link));
                     itor2; itor2 = fsg_arciter_next(itor2)) {
                    fsg_link_t *link = fsg_arciter_get(itor2);

                    if (link->wid == -1)
                        continue;
                    
                    if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL) {
                        ps_lattice_link(dag, src, dest, ascr, fh->frame);
                    }
                }
            }
        }
    }


    /* Figure out which nodes are the start and end nodes. */
    if ((dag->start = find_start_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the start node\n");
        goto error_out;
    }
    if ((dag->end = find_end_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the end node\n");
        goto error_out;
    }


    E_INFO("lattice start node %s.%d end node %s.%d\n",
           fsg_model_word_str(fsg, dag->start->wid), dag->start->sf,
           fsg_model_word_str(fsg, dag->end->wid), dag->end->sf);
    /* FIXME: Need to calculate final_node_ascr here. */

    /*
     * Convert word IDs from FSG to dictionary.
     */
    for (node = dag->nodes; node; node = node->next) {
        node->wid = dict_wordid(dag->search->dict,
                                fsg_model_word_str(fsg, node->wid));
        node->basewid = dict_basewid(dag->search->dict, node->wid);
    }

    /*
     * Now we are done, because the links in the graph are uniquely
     * defined by the history table.  However we should remove any
     * nodes which are not reachable from the end node of the FSG.
     * Everything is reachable from the start node by definition.
     */
    mark_reachable(dag, dag->end);

    ps_lattice_delete_unreachable(dag);
    {
        int32 silpen, fillpen;

        silpen = (int32)(logmath_log(fsg->lmath,
                                     ps_config_float(ps_search_config(fsgs), "silprob"))
                         * fsg->lw)
            >> SENSCR_SHIFT;
        fillpen = (int32)(logmath_log(fsg->lmath,
                                      ps_config_float(ps_search_config(fsgs), "fillprob"))
                          * fsg->lw)
            >> SENSCR_SHIFT;
	
	ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }
    search->dag = dag;

    return dag;


error_out:
    ps_lattice_free(dag);
    return NULL;

}